

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.h
# Opt level: O1

string * __thiscall
rest_rpc::rpc_service::msgpack_codec::
pack_args_str<rest_rpc::result_code,std::__cxx11::string_const&,std::__cxx11::string_const&,void>
          (string *__return_storage_ptr__,msgpack_codec *this,result_code arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__n;
  undefined6 in_register_00000012;
  char d;
  buffer_type buffer;
  undefined1 local_69;
  packer<msgpack::v1::sbuffer> local_68;
  int local_5c;
  sbuffer local_58;
  tuple<int_&&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_40;
  
  __n = args;
  msgpack::v1::sbuffer::sbuffer(&local_58,0x800);
  local_40.
  super__Tuple_impl<0UL,_int_&&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super__Head_base<0UL,_int_&&,_false>._M_head_impl = &local_5c;
  local_5c = (int)this;
  local_69 = 0x93;
  local_68.m_stream = &local_58;
  local_40.
  super__Tuple_impl<0UL,_int_&&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Tuple_impl<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Tuple_impl<2UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Head_base<2UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  ._M_head_impl =
       (_Head_base<2UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
        )(_Head_base<2UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
          )args;
  local_40.
  super__Tuple_impl<0UL,_int_&&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Tuple_impl<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  ._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CONCAT62(in_register_00000012,arg);
  msgpack::v1::sbuffer::write(&local_58,(int)&local_69,(void *)0x1,(size_t)__n);
  msgpack::v1::
  StdTuplePacker<msgpack::v1::sbuffer,_const_std::tuple<int_&&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_&,_3UL>
  ::pack(&local_68,&local_40);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_58.m_data,local_58.m_data + local_58.m_size);
  free(local_58.m_data);
  return __return_storage_ptr__;
}

Assistant:

static std::string pack_args_str(Arg arg, Args &&...args) {
    buffer_type buffer(init_size);
    msgpack::pack(buffer,
                  std::forward_as_tuple((int)arg, std::forward<Args>(args)...));
    return std::string(buffer.data(), buffer.size());
  }